

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int compute_num_tf_workers(AV1_COMP *cpi)

{
  long in_RDI;
  int mb_rows;
  int mb_height;
  BLOCK_SIZE block_size;
  int frame_height;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  if (*(uint *)(in_RDI + 0x42758) < 2) {
    local_4 = compute_num_enc_workers
                        ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0
                        );
  }
  else if (*(int *)(in_RDI + 0x42728) < 2) {
    local_4 = 1;
  }
  else {
    local_4 = get_num_blocks(*(int *)(in_RDI + 0x3bfbc),0x20);
    if (*(int *)(in_RDI + 0x42728) < local_4) {
      local_4 = *(int *)(in_RDI + 0x42728);
    }
  }
  return local_4;
}

Assistant:

static inline int compute_num_tf_workers(const AV1_COMP *cpi) {
  // For single-pass encode, using no. of workers as per tf block size was not
  // found to improve speed. Hence the thread assignment for single-pass encode
  // is kept based on compute_num_enc_workers().
  if (cpi->oxcf.pass < AOM_RC_SECOND_PASS)
    return compute_num_enc_workers(cpi, cpi->oxcf.max_threads);

  if (cpi->oxcf.max_threads <= 1) return 1;

  const int frame_height = cpi->common.height;
  const BLOCK_SIZE block_size = TF_BLOCK_SIZE;
  const int mb_height = block_size_high[block_size];
  const int mb_rows = get_num_blocks(frame_height, mb_height);
  return AOMMIN(cpi->oxcf.max_threads, mb_rows);
}